

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

wchar_t edit_pathname(bsdtar *bsdtar,archive_entry *entry)

{
  char cVar1;
  int iVar2;
  char *in_RAX;
  char *name;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  wchar_t wVar6;
  char *name_00;
  char *p;
  bool bVar7;
  char *subst_name;
  char *local_38;
  
  local_38 = in_RAX;
  name = archive_entry_pathname(entry);
  pcVar3 = archive_entry_hardlink(entry);
  iVar2 = apply_substitution(bsdtar,name,&local_38,0,0);
  if (iVar2 == 1) {
    archive_entry_copy_pathname(entry,local_38);
    cVar1 = *local_38;
    free(local_38);
    if (cVar1 == '\0') {
      return L'\xffffffff';
    }
    name = archive_entry_pathname(entry);
LAB_0010e778:
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      iVar2 = apply_substitution(bsdtar,pcVar3,&local_38,0,1);
      if (iVar2 == 1) {
        archive_entry_copy_hardlink(entry,local_38);
        free(local_38);
      }
      else if (iVar2 == -1) goto LAB_0010e800;
      pcVar3 = archive_entry_hardlink(entry);
    }
    pcVar4 = archive_entry_symlink(entry);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = archive_entry_symlink(entry);
      iVar2 = apply_substitution(bsdtar,pcVar4,&local_38,1,0);
      if (iVar2 == 1) {
        archive_entry_copy_symlink(entry,local_38);
        free(local_38);
      }
      else if (iVar2 == -1) goto LAB_0010e800;
    }
    iVar2 = bsdtar->strip_components;
    pcVar4 = name;
    p = pcVar3;
    iVar5 = iVar2;
    if (0 < iVar2) {
      do {
        if (*pcVar4 == '/') {
          iVar5 = iVar5 + -1;
        }
        else if (*pcVar4 == '\0') goto LAB_0010e810;
        pcVar4 = pcVar4 + 1;
      } while (0 < iVar5);
      for (; *pcVar4 == '/'; pcVar4 = pcVar4 + 1) {
      }
      if (*pcVar4 == '\0') goto LAB_0010e810;
      if (pcVar3 == (char *)0x0) {
        p = (char *)0x0;
      }
      else {
        do {
          if (*p == '/') {
            iVar2 = iVar2 + -1;
          }
          else if (*p == '\0') goto LAB_0010e810;
          p = p + 1;
        } while (0 < iVar2);
        for (; *p == '/'; p = p + 1) {
        }
        if (*p == '\0') goto LAB_0010e810;
      }
    }
    if ((bsdtar->flags & 2) == 0) {
      pcVar4 = strip_absolute_path(bsdtar,pcVar4);
      name_00 = ".";
      if (*pcVar4 != '\0') {
        name_00 = pcVar4;
      }
      if (p == (char *)0x0) {
        p = (char *)0x0;
      }
      else {
        p = strip_absolute_path(bsdtar,p);
        if (*p == '\0') goto LAB_0010e810;
      }
    }
    else {
      bVar7 = *pcVar4 == '/';
      do {
        name_00 = pcVar4;
        if (!bVar7) break;
        bVar7 = true;
        pcVar4 = name_00 + 1;
      } while (name_00[1] == '/');
    }
    if (name_00 != name) {
      archive_entry_copy_pathname(entry,name_00);
    }
    wVar6 = L'\0';
    if (p != pcVar3) {
      archive_entry_copy_hardlink(entry,p);
      wVar6 = L'\0';
    }
  }
  else {
    if (iVar2 != -1) goto LAB_0010e778;
LAB_0010e800:
    lafe_warnc(0,"Invalid substitution, skipping entry");
LAB_0010e810:
    wVar6 = L'\x01';
  }
  return wVar6;
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
	const char *original_name = name;
	const char *hardlinkname = archive_entry_hardlink(entry);
	const char *original_hardlinkname = hardlinkname;
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H) || defined(HAVE_PCRE2POSIX_H)
	char *subst_name;
	int r;

	/* Apply user-specified substitution to pathname. */
	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
		original_name = name;
	}

	/* Apply user-specified substitution to hardlink target. */
	if (hardlinkname != NULL) {
		r = apply_substitution(bsdtar, hardlinkname, &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
		hardlinkname = archive_entry_hardlink(entry);
		original_hardlinkname = hardlinkname;
	}

	/* Apply user-specified substitution to symlink body. */
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (hardlinkname != NULL) {
			hardlinkname = strip_components(hardlinkname,
			    bsdtar->strip_components);
			if (hardlinkname == NULL)
				return (1);
		}
	}

	if ((bsdtar->flags & OPTFLAG_ABSOLUTE_PATHS) == 0) {
		/* By default, don't write or restore absolute pathnames. */
		name = strip_absolute_path(bsdtar, name);
		if (*name == '\0')
			name = ".";

		if (hardlinkname != NULL) {
			hardlinkname = strip_absolute_path(bsdtar, hardlinkname);
			if (*hardlinkname == '\0')
				return (1);
		}
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Replace name in archive_entry. */
	if (name != original_name) {
		archive_entry_copy_pathname(entry, name);
	}
	if (hardlinkname != original_hardlinkname) {
		archive_entry_copy_hardlink(entry, hardlinkname);
	}
	return (0);
}